

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O1

word_type __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
get(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
   size_t begin,size_t end)

{
  _Elt_pointer puVar1;
  sbyte sVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  _Elt_pointer puVar9;
  ulong uVar10;
  
  uVar5 = begin >> 6;
  uVar7 = end - (end != 0) >> 6;
  puVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar3 = (long)puVar1 -
          (long)(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar8 = lVar3 + uVar7;
  if (uVar8 < 0x40) {
    puVar9 = puVar1 + uVar7;
  }
  else {
    uVar10 = uVar8 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar8) {
      uVar10 = uVar8 >> 6;
    }
    puVar9 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar8 + uVar10 * -0x40;
  }
  bVar6 = 0x40 - (-(char)end & 0x3fU);
  sVar2 = (bVar6 < 0x41) * ('@' - bVar6);
  uVar8 = (*puVar9 << sVar2) >> sVar2;
  if (uVar5 < uVar7) {
    uVar7 = lVar3 + uVar5;
    if (uVar7 < 0x40) {
      puVar4 = puVar1 + uVar5;
    }
    else {
      uVar5 = uVar7 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar7) {
        uVar5 = uVar7 >> 6;
      }
      puVar4 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar7 + uVar5 * -0x40;
    }
    bVar6 = (byte)begin & 0x3f;
    uVar5 = *puVar4 >> bVar6 | uVar8 << 0x40 - bVar6;
  }
  else {
    uVar5 = 0;
    if (begin < end) {
      uVar5 = uVar8 >> (begin & 0x3f);
    }
  }
  return uVar5;
}

Assistant:

bitview_base::word_type
        bitview<C>::get(size_t begin, size_t end) const
        {
            static constexpr size_t bits = bitsize<word_type>();
            static constexpr size_t mask = ~ size_t(0) / bits * bits;
            
            // everything above has been computed at compile time.
            // Now do some work:
            
            // the index in the container of
            // the lower or higher item needed
            size_t lo_index = (begin          ) / bits;
            size_t hi_index = (end - (end > 0)) / bits;
            
            // we read container[hi_adr] first and possibly delete
            // the highest bits:
            size_t hi_shift = size_t(mask - end) % bits;
            word_type hi_val = _container[hi_index] << hi_shift >> hi_shift;
            
            // if all bits are in the same item,
            // we delete the lower bits and are done:
            size_t lo_shift = begin % bits;
            if ( hi_index <= lo_index )
                return (hi_val >> lo_shift) * (begin < end);
            
            // else we have to read the lower item as well, and combine both
            return ( hi_val << (bits - lo_shift)    |
                     _container[lo_index] >> lo_shift );
            
        }